

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.c
# Opt level: O0

void lws_header_table_reset(lws *wsi,int autoservice)

{
  lws_context_per_thread *pt;
  int autoservice_local;
  lws *wsi_local;
  
  __lws_header_table_reset(wsi,autoservice);
  return;
}

Assistant:

void
_lws_header_table_reset(struct allocated_headers *ah)
{
	/* init the ah to reflect no headers or data have appeared yet */
	memset(ah->frag_index, 0, sizeof(ah->frag_index));
	memset(ah->frags, 0, sizeof(ah->frags));
	ah->nfrag = 0;
	ah->pos = 0;
	ah->http_response = 0;
	ah->parser_state = WSI_TOKEN_NAME_PART;
	ah->lextable_pos = 0;
#if defined(LWS_WITH_CUSTOM_HEADERS)
	ah->unk_pos = 0;
	ah->unk_ll_head = 0;
	ah->unk_ll_tail = 0;
#endif
}